

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O2

void __thiscall
JetHead::list<Selector::ListenerNode_*>::push_back
          (list<Selector::ListenerNode_*> *this,ListenerNode **val)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar3 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0xa7);
  pNVar3->val = *val;
  pNVar1 = this->mTail;
  pNVar2 = pNVar1->prev;
  pNVar3->prev = pNVar2;
  pNVar3->next = pNVar1;
  pNVar2->next = pNVar3;
  pNVar1->prev = pNVar3;
  return;
}

Assistant:

void push_back(const T& val)
		{
			Node* newTail = jh_new Node;
			newTail->val = val;
			newTail->prev = mTail->prev;
			newTail->next = mTail;

			mTail->prev->next = newTail;
			mTail->prev = newTail;
		}